

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Declaration_Object.cpp
# Opt level: O2

void __thiscall
psy::C::ObjectDeclarationSymbol::ObjectDeclarationSymbol
          (ObjectDeclarationSymbol *this,SymbolKind symK,Symbol *containingSym,SyntaxTree *tree,
          Scope *enclosingScope)

{
  DeclarationImpl *p;
  undefined7 in_register_00000031;
  
  p = (DeclarationImpl *)operator_new(0x38);
  (p->super_SymbolImpl).containingSym_ = containingSym;
  p->tree_ = tree;
  p->enclosingScope_ = enclosingScope;
  p->denotedTy_ = (Type *)0x0;
  *(ushort *)&(p->super_SymbolImpl).field_1 = (ushort)CONCAT71(in_register_00000031,symK) | 0x300;
  p[1].super_SymbolImpl.containingSym_ = (Symbol *)0x0;
  *(undefined8 *)&p[1].super_SymbolImpl.field_1 = 0;
  DeclarationSymbol::DeclarationSymbol(&this->super_DeclarationSymbol,p);
  (this->super_DeclarationSymbol).super_Symbol._vptr_Symbol =
       (_func_int **)&PTR__ObjectDeclarationSymbol_004d77a0;
  (this->super_MIXIN_NameableDeclarationSymbol)._vptr_MIXIN_NameableDeclarationSymbol =
       (_func_int **)&PTR__ObjectDeclarationSymbol_004d78f8;
  (this->super_MIXIN_TypeableDeclarationSymbol)._vptr_MIXIN_TypeableDeclarationSymbol =
       (_func_int **)&PTR__ObjectDeclarationSymbol_004d7928;
  return;
}

Assistant:

ObjectDeclarationSymbol::ObjectDeclarationSymbol(SymbolKind symK,
                                                 const Symbol* containingSym,
                                                 const SyntaxTree* tree,
                                                 const Scope* enclosingScope)
    : DeclarationSymbol(
          new ObjectDeclarationImpl(symK,
                                    containingSym,
                                    tree,
                                    enclosingScope))
{}